

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::net::http::Method_testParse_Test::TestBody(Method_testParse_Test *this)

{
  char *pcVar1;
  allocator local_49;
  Method local_48 [2];
  AssertionResult gtest_ar;
  string local_30 [36];
  Method local_c;
  
  local_48[0] = OPTIONS;
  std::__cxx11::string::string(local_30,"OPTIONS",&local_49);
  local_c = jaegertracing::net::http::parseMethod(local_30);
  testing::internal::CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
            ((internal *)&gtest_ar,"Method::OPTIONS","parseMethod(\"OPTIONS\")",local_48,&local_c);
  std::__cxx11::string::~string(local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
               ,0x1a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)local_30);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_48[0] = GET;
    std::__cxx11::string::string(local_30,"GET",&local_49);
    local_c = jaegertracing::net::http::parseMethod(local_30);
    testing::internal::
    CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
              ((internal *)&gtest_ar,"Method::GET","parseMethod(\"GET\")",local_48,&local_c);
    std::__cxx11::string::~string(local_30);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)local_30);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                 ,0x1b,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)local_30);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_48[0] = HEAD;
      std::__cxx11::string::string(local_30,"HEAD",&local_49);
      local_c = jaegertracing::net::http::parseMethod(local_30);
      testing::internal::
      CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                ((internal *)&gtest_ar,"Method::HEAD","parseMethod(\"HEAD\")",local_48,&local_c);
      std::__cxx11::string::~string(local_30);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                   ,0x1c,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)local_30);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_48[0] = POST;
        std::__cxx11::string::string(local_30,"POST",&local_49);
        local_c = jaegertracing::net::http::parseMethod(local_30);
        testing::internal::
        CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                  ((internal *)&gtest_ar,"Method::POST","parseMethod(\"POST\")",local_48,&local_c);
        std::__cxx11::string::~string(local_30);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)local_30);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                     ,0x1d,pcVar1);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)local_30);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          local_48[0] = PUT;
          std::__cxx11::string::string(local_30,"PUT",&local_49);
          local_c = jaegertracing::net::http::parseMethod(local_30);
          testing::internal::
          CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                    ((internal *)&gtest_ar,"Method::PUT","parseMethod(\"PUT\")",local_48,&local_c);
          std::__cxx11::string::~string(local_30);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)local_30);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_48,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                       ,0x1e,pcVar1);
            testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)local_30)
            ;
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            local_48[0] = DELETE;
            std::__cxx11::string::string(local_30,"DELETE",&local_49);
            local_c = jaegertracing::net::http::parseMethod(local_30);
            testing::internal::
            CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                      ((internal *)&gtest_ar,"Method::DELETE","parseMethod(\"DELETE\")",local_48,
                       &local_c);
            std::__cxx11::string::~string(local_30);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)local_30);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_48,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                         ,0x1f,pcVar1);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_48,(Message *)local_30);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              local_48[0] = TRACE;
              std::__cxx11::string::string(local_30,"TRACE",&local_49);
              local_c = jaegertracing::net::http::parseMethod(local_30);
              testing::internal::
              CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                        ((internal *)&gtest_ar,"Method::TRACE","parseMethod(\"TRACE\")",local_48,
                         &local_c);
              std::__cxx11::string::~string(local_30);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)local_30);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_48,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                           ,0x20,pcVar1);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_48,(Message *)local_30);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                local_48[0] = CONNECT;
                std::__cxx11::string::string(local_30,"CONNECT",&local_49);
                local_c = jaegertracing::net::http::parseMethod(local_30);
                testing::internal::
                CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                          ((internal *)&gtest_ar,"Method::CONNECT","parseMethod(\"CONNECT\")",
                           local_48,&local_c);
                std::__cxx11::string::~string(local_30);
                if (gtest_ar.success_ != false) {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  local_48[0] = EXTENSION;
                  std::__cxx11::string::string(local_30,"post",&local_49);
                  local_c = jaegertracing::net::http::parseMethod(local_30);
                  testing::internal::
                  CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                            ((internal *)&gtest_ar,"Method::EXTENSION","parseMethod(\"post\")",
                             local_48,&local_c);
                  std::__cxx11::string::~string(local_30);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)local_30);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar1 = "";
                    }
                    else {
                      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)local_48,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                               ,0x22,pcVar1);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)local_48,(Message *)local_30);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_30);
                  }
                  goto LAB_001c8c99;
                }
                testing::Message::Message((Message *)local_30);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_48,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                           ,0x21,pcVar1);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_48,(Message *)local_30);
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_30);
LAB_001c8c99:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(Method, testParse)
{
    ASSERT_EQ(Method::OPTIONS, parseMethod("OPTIONS"));
    ASSERT_EQ(Method::GET, parseMethod("GET"));
    ASSERT_EQ(Method::HEAD, parseMethod("HEAD"));
    ASSERT_EQ(Method::POST, parseMethod("POST"));
    ASSERT_EQ(Method::PUT, parseMethod("PUT"));
    ASSERT_EQ(Method::DELETE, parseMethod("DELETE"));
    ASSERT_EQ(Method::TRACE, parseMethod("TRACE"));
    ASSERT_EQ(Method::CONNECT, parseMethod("CONNECT"));
    ASSERT_EQ(Method::EXTENSION, parseMethod("post"));
}